

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

long passthrough_resampler_fill_input_left
               (cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,
               long nframes)

{
  void *pvVar1;
  bool bVar2;
  stringstream *psVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  iVar4 = *user_ptr;
  local_48 = nframes;
  local_40 = nframes;
  local_38 = input_buffer;
  if (iVar4 == 3) {
    local_68.ptr_._0_4_ = 0x20;
    testing::internal::CmpHelperEQ<long,int>(local_60,"nframes","32",&local_40,(int *)&local_68);
    if (local_60[0] != (internal)0x0) {
      lVar6 = 0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pvVar1 = local_38;
      do {
        testing::internal::CmpHelperFloatingPointEQ<float>
                  (local_60,"input[i]","0.01 * (i + 32)",*(float *)((long)pvVar1 + lVar6 * 4),
                   (float)(int)((uint)lVar6 | 0x20) * 0.01);
        if (local_60[0] == (internal)0x0) {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_58.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
          }
          iVar4 = 0x3f6;
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
          goto LAB_0010c1ca;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x20);
      lVar6 = 0;
      while( true ) {
        testing::internal::CmpHelperFloatingPointEQ<float>
                  (local_60,"input[i + 32]","0.01 * i",*(float *)((long)pvVar1 + lVar6 * 4 + 0x80),
                   (float)(int)lVar6 * 0.01);
        if (local_60[0] == (internal)0x0) {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_58.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
          }
          iVar4 = 0x3fa;
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
          goto LAB_0010c2fc;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  (local_60,"input[i + 32 + 16]","0.0",*(float *)((long)pvVar1 + lVar6 * 4 + 0xc0),
                   0.0);
        if (local_60[0] == (internal)0x0) break;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar6 = lVar6 + 1;
        if (lVar6 == 0x10) {
          return local_48;
        }
      }
      psVar3 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar3);
      *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      iVar4 = 0x3fc;
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
LAB_0010c33f:
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,iVar4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
joined_r0x0010c31b:
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      goto LAB_0010c38a;
    }
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    iVar4 = 0x3f1;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
  }
  else if (iVar4 == 2) {
    local_68.ptr_._0_4_ = 0x20;
    testing::internal::CmpHelperEQ<long,int>(local_60,"nframes","32",&local_40,(int *)&local_68);
    if (local_60[0] != (internal)0x0) {
      lVar6 = 0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pvVar1 = local_38;
      do {
        testing::internal::CmpHelperFloatingPointEQ<float>
                  (local_60,"input[i]","0.01 * (i + 64)",*(float *)((long)pvVar1 + lVar6 * 4),
                   (float)(int)((uint)lVar6 | 0x40) * 0.01);
        if (local_60[0] == (internal)0x0) {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_58.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
          }
          iVar4 = 0x3ea;
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
LAB_0010c2fc:
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,iVar4,pcVar5);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          goto joined_r0x0010c31b;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  (local_60,"input[i + 32]","0.01 * i",*(float *)((long)pvVar1 + lVar6 * 4 + 0x80),
                   (float)(int)(uint)lVar6 * 0.01);
        if (local_60[0] == (internal)0x0) {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_58.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
          }
          iVar4 = 0x3ec;
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
          goto LAB_0010c33f;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar6 = lVar6 + 1;
        if (lVar6 == 0x20) {
          return local_48;
        }
      } while( true );
    }
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    iVar4 = 0x3e5;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
  }
  else {
    if (iVar4 != 1) {
      return nframes;
    }
    local_68.ptr_._0_4_ = 0x20;
    testing::internal::CmpHelperEQ<long,int>(local_60,"nframes","32",&local_40,(int *)&local_68);
    if (local_60[0] != (internal)0x0) {
      lVar6 = 0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pvVar1 = local_38;
      while (testing::internal::CmpHelperFloatingPointEQ<float>
                       (local_60,"input[i]","0.01 * i",*(float *)((long)pvVar1 + lVar6 * 4),
                        (float)(int)lVar6 * 0.01), local_60[0] != (internal)0x0) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar6 = lVar6 + 1;
        if (lVar6 == 0x40) {
          return local_48;
        }
      }
      psVar3 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar3);
      *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      iVar4 = 0x3e0;
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
LAB_0010c1ca:
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,iVar4,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      goto LAB_0010c38a;
    }
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    iVar4 = 0x3dd;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,iVar4,pcVar5);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if (local_68.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_68.ptr_ + 8))();
    }
    local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
LAB_0010c38a:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return local_48;
}

Assistant:

static long
passthrough_resampler_fill_input_left(cubeb_stream * stream,
                                     void * user_ptr,
                                     void const * input_buffer,
                                     void * output_buffer,
                                     long nframes) {
  // gtest does not support using ASSERT_EQ and friends in a
  // function that returns a value.
  int iteration = *static_cast<int*>(user_ptr);
  if (iteration == 1) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 64; ++i) {
        ASSERT_FLOAT_EQ(input[i], 0.01 * i);
      }
    }();
  } else if (iteration == 2) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 32; ++i) {
        // First part contains the reamaining input samples from previous
        // iteration (since they were more).
        ASSERT_FLOAT_EQ(input[i], 0.01 * (i + 64));
        // next part contains the new buffer
        ASSERT_FLOAT_EQ(input[i + 32], 0.01 * i);
      }
    }();
  } else if (iteration == 3) {
    [nframes, input_buffer]() {
      ASSERT_EQ(nframes, 32);
      const float* input = static_cast<const float*>(input_buffer);
      for (int i = 0; i < 32; ++i) {
        // First part (16 frames) contains the reamaining input samples
        // from previous iteration (since they were more).
        ASSERT_FLOAT_EQ(input[i], 0.01 * (i + 32));
      }
      for (int i = 0; i < 16; ++i) {
        // next part (8 frames) contains the new input buffer.
        ASSERT_FLOAT_EQ(input[i + 32], 0.01 * i);
        // last part (8 frames) contains silence.
        ASSERT_FLOAT_EQ(input[i + 32 + 16], 0.0);
      }
    }();
  }
  return nframes;
}